

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O2

void __thiscall CArgumentList::Add(CArgumentList *this,CArgument *_argument)

{
  __uniq_ptr_impl<CArgument,_std::default_delete<CArgument>_> local_10;
  
  local_10._M_t.super__Tuple_impl<0UL,_CArgument_*,_std::default_delete<CArgument>_>.
  super__Head_base<0UL,_CArgument_*,_false>._M_head_impl =
       (tuple<CArgument_*,_std::default_delete<CArgument>_>)
       (tuple<CArgument_*,_std::default_delete<CArgument>_>)_argument;
  std::
  vector<std::unique_ptr<CArgument,std::default_delete<CArgument>>,std::allocator<std::unique_ptr<CArgument,std::default_delete<CArgument>>>>
  ::emplace_back<std::unique_ptr<CArgument,std::default_delete<CArgument>>>
            ((vector<std::unique_ptr<CArgument,std::default_delete<CArgument>>,std::allocator<std::unique_ptr<CArgument,std::default_delete<CArgument>>>>
              *)&this->arguments,(unique_ptr<CArgument,_std::default_delete<CArgument>_> *)&local_10
            );
  if ((_Tuple_impl<0UL,_CArgument_*,_std::default_delete<CArgument>_>)
      local_10._M_t.super__Tuple_impl<0UL,_CArgument_*,_std::default_delete<CArgument>_>.
      super__Head_base<0UL,_CArgument_*,_false>._M_head_impl != (CArgument *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_CArgument_*,_std::default_delete<CArgument>_>.
                          super__Head_base<0UL,_CArgument_*,_false>._M_head_impl + 0x10))();
  }
  return;
}

Assistant:

void CArgumentList::Add(CArgument* _argument) {
	arguments.push_back(std::unique_ptr<CArgument>(_argument));
}